

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_SimRsbFree(Gia_SimRsbMan_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Wrd_t *pVVar2;
  
  Gia_ManStaticFanoutStop(p->pGia);
  pVVar1 = p->vTfo;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCands;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vFanins;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vFanins2;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vSimsObj;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vSimsObj2;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  if (p->pFunc[0] != (word *)0x0) {
    free(p->pFunc[0]);
    p->pFunc[0] = (word *)0x0;
  }
  if (p->pFunc[1] != (word *)0x0) {
    free(p->pFunc[1]);
    p->pFunc[1] = (word *)0x0;
  }
  if (p->pFunc[2] != (word *)0x0) {
    free(p->pFunc[2]);
    p->pFunc[2] = (word *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Gia_SimRsbFree( Gia_SimRsbMan_t * p )
{
    Gia_ManStaticFanoutStop( p->pGia );
    Vec_IntFree( p->vTfo );
    Vec_IntFree( p->vCands );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vFanins2 );
    Vec_WrdFree( p->vSimsObj );
    Vec_WrdFree( p->vSimsObj2 );
    ABC_FREE( p->pFunc[0] );
    ABC_FREE( p->pFunc[1] );
    ABC_FREE( p->pFunc[2] );
    ABC_FREE( p );
}